

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledArgOut_A<Js::OpLayoutDynamicProfile<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
          *playout)

{
  byte bVar1;
  FunctionBody *this_00;
  Var value;
  code *pcVar2;
  bool bVar3;
  DynamicProfileInfo *this_01;
  undefined4 *puVar4;
  
  this_00 = *(FunctionBody **)(this + 0x88);
  this_01 = FunctionBody::GetDynamicProfileInfo(this_00);
  if ((playout->super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).Reg < 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2185,"(playout->Reg > FunctionBody::FirstRegSlot)",
                                "playout->Reg > FunctionBody::FirstRegSlot");
    if (!bVar3) goto LAB_00a5bbc4;
    *puVar4 = 0;
  }
  value = *(Var *)(this + (ulong)(playout->
                                 super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).Reg
                          * 8 + 0x160);
  ValidateRegValue(this,value,false,true);
  DynamicProfileInfo::RecordParameterAtCallSite
            (this_01,this_00,playout->profileId,value,
             (uint)(playout->super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).Arg,
             (uint)(playout->super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).Reg);
  bVar1 = (playout->super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).Arg;
  if (*(ulong *)(this + 0x30) <= (ulong)((uint)bVar1 * 8) + *(long *)(this + 0x28)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x940,"(m_outParams + outRegisterID < m_outSp)",
                                "m_outParams + outRegisterID < m_outSp");
    if (!bVar3) {
LAB_00a5bbc4:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  *(Var *)(*(long *)(this + 0x28) + (ulong)bVar1 * 8) = value;
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledArgOut_A(const unaligned T * playout)
    {
        FunctionBody* functionBody = this->m_functionBody;
        DynamicProfileInfo * dynamicProfileInfo = functionBody->GetDynamicProfileInfo();

        Assert(playout->Reg > FunctionBody::FirstRegSlot);
        Var value = GetReg(playout->Reg);
        dynamicProfileInfo->RecordParameterAtCallSite(functionBody, playout->profileId, value, playout->Arg, playout->Reg);
        SetOut(playout->Arg, value);
    }